

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                    sqlite3_value **apVal)

{
  Fts3Table *pFVar1;
  sqlite3_vtab *psVar2;
  bool bVar3;
  sqlite3_tokenizer_cursor *psVar4;
  sqlite3_value *psVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  sqlite3_int64 sVar11;
  byte *pbVar12;
  ulong uVar13;
  Fts3Expr *pFVar14;
  size_t sVar15;
  ulong uVar16;
  Fts3Expr *pFVar17;
  Fts3TokenAndCost *aTC;
  Fts3Expr *pFVar18;
  Mem *pMem;
  byte *zRight;
  int iVar19;
  Fts3Cursor *pCsr;
  int iVar20;
  char *pcVar21;
  long lVar22;
  ulong uVar23;
  Fts3TokenAndCost *pFVar24;
  sqlite3_value *pVal;
  uint uVar25;
  long lVar26;
  sqlite3_tokenizer_module *psVar27;
  Fts3Expr **ppFVar28;
  long lVar29;
  Fts3Phrase *pFVar30;
  byte *pbVar31;
  u8 uVar32;
  bool bVar33;
  Fts3Expr *local_120;
  int nByte;
  int iBegin;
  byte *local_110;
  ulong local_108;
  Fts3Expr *local_100;
  uint local_f8;
  int iEnd;
  sqlite3_tokenizer_cursor *local_f0;
  Fts3Cursor *local_e8;
  byte *local_e0;
  Fts3Expr *local_d8;
  Fts3Expr *local_d0;
  Fts3Expr *local_c8;
  uint local_c0;
  uint local_bc;
  undefined8 local_b8;
  sqlite3_tokenizer_cursor *pCursor_1;
  uint local_a8;
  int local_a4;
  ulong local_a0;
  Fts3Table *local_98;
  char *zByte;
  i64 local_88;
  sqlite3_value *local_80;
  sqlite3_tokenizer *local_78;
  char **local_70;
  Fts3Expr **local_68;
  sqlite3_value *local_60;
  sqlite3_tokenizer_module *local_58;
  sqlite3_value *local_50;
  ulong local_48;
  char **local_40;
  ulong local_38;
  
  local_bc = idxNum & 0xffff;
  if (local_bc == 0) {
    local_60 = (sqlite3_value *)0x0;
  }
  else {
    local_60 = *apVal;
  }
  bVar3 = local_bc != 0;
  uVar13 = (ulong)bVar3;
  if (((uint)idxNum >> 0x10 & 1) == 0) {
    pMem = (Mem *)0x0;
    uVar23 = uVar13;
  }
  else {
    uVar23 = (ulong)(bVar3 + 1);
    pMem = apVal[uVar13];
  }
  uVar9 = (uint)uVar23;
  if (((uint)idxNum >> 0x11 & 1) == 0) {
    local_80 = (sqlite3_value *)0x0;
  }
  else {
    uVar9 = uVar9 + 1;
    local_80 = apVal[uVar23];
  }
  if (((uint)idxNum >> 0x12 & 1) == 0) {
    pVal = (sqlite3_value *)0x0;
  }
  else {
    pVal = apVal[uVar9];
  }
  pFVar1 = (Fts3Table *)pCursor->pVtab;
  local_e8 = (Fts3Cursor *)pCursor;
  local_a8 = idxNum;
  fts3ClearCursor((Fts3Cursor *)pCursor);
  sVar11 = fts3DocidRange(local_80,-0x8000000000000000);
  local_e8->iMinDocid = sVar11;
  sVar11 = fts3DocidRange(pVal,0x7fffffffffffffff);
  psVar5 = local_60;
  local_e8->iMaxDocid = sVar11;
  if (idxStr == (char *)0x0) {
    uVar32 = pFVar1->bDescIdx;
  }
  else {
    uVar32 = *idxStr == 'D';
  }
  local_e8->bDesc = uVar32;
  local_e8->eSearch = (i16)local_a8;
  pCsr = local_e8;
  local_98 = pFVar1;
  local_50 = pVal;
  if (1 < local_bc) {
    pbVar12 = sqlite3_value_text(local_60);
    if ((pbVar12 == (byte *)0x0) &&
       (uVar9._0_2_ = psVar5->flags, uVar9._2_1_ = psVar5->enc, uVar9._3_1_ = psVar5->eSubtype,
       (0xaaaaaaaaU >> (uVar9 & 0x1f) & 1) == 0)) {
      return 7;
    }
    local_e8->iLangid = 0;
    if (pMem == (Mem *)0x0) {
      local_88 = 0;
    }
    else {
      local_88 = sqlite3VdbeIntValue(pMem);
      local_e8->iLangid = (int)local_88;
    }
    if (pbVar12 == (byte *)0x0) {
      local_e8->pExpr = (Fts3Expr *)0x0;
LAB_001a2873:
      pFVar17 = (Fts3Expr *)0x0;
    }
    else {
      local_bc = local_bc - 2;
      local_70 = &(local_98->base).zErrMsg;
      local_40 = local_98->azColumn;
      local_78 = local_98->pTokenizer;
      uVar9 = local_98->nColumn;
      uVar32 = local_98->bFts4;
      local_68 = &local_e8->pExpr;
      uVar13 = strlen((char *)pbVar12);
      local_d0 = (Fts3Expr *)0x0;
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      local_38 = (ulong)uVar9;
      uVar9 = 0;
      local_f8 = 1;
      pFVar17 = (Fts3Expr *)0x0;
      local_100 = (Fts3Expr *)0x0;
      pbVar31 = pbVar12;
      local_110 = pbVar12;
      local_c0 = local_f8;
      while (ppFVar28 = local_68, uVar9 == 0) {
        uVar23 = uVar13 & 0xffffffff;
        zRight = pbVar12;
        while (iVar19 = (int)uVar23, local_e0 = pbVar12, local_d8 = pFVar17, 0 < iVar19) {
          if ((0x20 < (ulong)*zRight) || ((0x100003e00U >> ((ulong)*zRight & 0x3f) & 1) == 0))
          goto LAB_001a1e66;
          zRight = zRight + 1;
          uVar23 = (ulong)(iVar19 - 1);
        }
        iVar7 = 0;
        iVar19 = (int)uVar13;
        if ((int)uVar13 < 0) {
LAB_001a1e66:
          local_120._0_4_ = (int)zRight - (int)pbVar12;
          local_c8 = (Fts3Expr *)0x0;
          local_f0 = (sqlite3_tokenizer_cursor *)((ulong)local_f0 & 0xffffffff00000000);
          local_108 = uVar13;
          for (lVar29 = 0; pbVar31 = local_110, iVar8 = (int)uVar13, lVar29 != 4;
              lVar29 = lVar29 + 1) {
            lVar26 = lVar29 * 0x10;
            if ((&DAT_001fba09)[lVar26] == '\0') {
              uVar23 = (ulong)(byte)(&DAT_001fba08)[lVar26];
              if (((int)(uint)(byte)(&DAT_001fba08)[lVar26] <= iVar19) &&
                 (iVar7 = bcmp(zRight,(void *)(&getNextNode_aKeyword)[lVar29 * 2],uVar23),
                 iVar7 == 0)) {
                if (((byte)(&DAT_001fba0a)[lVar26] == 1) && (zRight[4] == 0x2f)) {
                  bVar6 = zRight[5];
                  iVar7 = 10;
                  if ((byte)(bVar6 - 0x30) < 10) {
                    iVar7 = 0;
                    lVar22 = 6;
                    while ((byte)(bVar6 - 0x30) < 10) {
                      iVar7 = (uint)(byte)(bVar6 - 0x30) + iVar7 * 10;
                      pbVar12 = zRight + lVar22;
                      lVar22 = lVar22 + 1;
                      bVar6 = *pbVar12;
                    }
                    uVar23 = (ulong)((int)lVar22 - 1);
                  }
                }
                else {
                  iVar7 = 10;
                }
                bVar6 = zRight[uVar23];
                uVar16 = (ulong)bVar6;
                if ((uVar16 < 0x2a) && ((0x30500003e01U >> (uVar16 & 0x3f) & 1) != 0)) {
                  local_a0 = 0x30400000001 >> (bVar6 & 0x3f);
                  local_b8._0_4_ = (uint)(byte)(&DAT_001fba0a)[lVar26];
                  pFVar14 = (Fts3Expr *)fts3MallocZero(0x40);
                  iVar8 = (int)local_108;
                  pbVar31 = local_110;
                  pbVar12 = local_e0;
                  if (pFVar14 == (Fts3Expr *)0x0) {
                    local_b8 = (byte *)CONCAT44(local_b8._4_4_,7);
                    if ((local_a0 & 1) == 0) {
                      uVar9 = 7;
                      pFVar17 = local_d8;
                      iVar7 = (int)local_f0;
                      goto LAB_001a1e4c;
                    }
                  }
                  else {
                    pFVar14->eType = (uint)local_b8;
                    pFVar14->nNear = iVar7;
                    iVar7 = (int)uVar23 + (int)local_120;
                    local_b8 = (byte *)((ulong)local_b8._4_4_ << 0x20);
                    if ((local_a0 & 1) == 0) {
                      bVar3 = true;
                      uVar9 = 0;
                      goto LAB_001a2653;
                    }
                    local_f0 = (sqlite3_tokenizer_cursor *)CONCAT44(local_f0._4_4_,iVar7);
                    local_c8 = pFVar14;
                  }
                }
                iVar8 = (int)local_108;
                uVar13 = local_108;
                if ((bVar6 < 0x2a) && ((0x30400000001U >> (uVar16 & 0x3f) & 1) != 0)) {
                  bVar3 = true;
                  pbVar12 = local_e0;
                  pFVar14 = local_c8;
                  pbVar31 = local_110;
                  uVar9 = (uint)local_b8;
                  iVar7 = (int)local_f0;
                  goto LAB_001a2653;
                }
              }
            }
          }
          if (*zRight == 0x22) {
            iVar20 = 1;
            if (1 < iVar19) {
              iVar20 = iVar19;
            }
            for (lVar29 = 1; lVar29 < iVar19; lVar29 = lVar29 + 1) {
              if (zRight[lVar29] == 0x22) {
                iVar20 = (int)lVar29;
                break;
              }
            }
            iVar7 = (int)local_120 + iVar20 + 1;
            if (iVar20 == iVar19) {
              uVar9 = 1;
              goto LAB_001a1e3c;
            }
            local_b8 = zRight + 1;
            psVar27 = local_78->pModule;
            pCursor_1 = (sqlite3_tokenizer_cursor *)0x0;
            uVar9 = sqlite3Fts3OpenTokenizer
                              (local_78,(int)local_88,(char *)local_b8,iVar20 - 1U,&pCursor_1);
            pbVar12 = local_b8;
            local_58 = psVar27;
            if (uVar9 == 0) {
              local_f0 = (sqlite3_tokenizer_cursor *)0x0;
              local_120 = (Fts3Expr *)0x0;
              local_c8 = (Fts3Expr *)0x0;
              local_a0 = local_a0 & 0xffffffff00000000;
              iVar19 = 0;
              uVar9 = 0;
              local_48 = (ulong)(iVar20 - 1U);
              while (iVar8 = (int)uVar13, uVar9 == 0) {
                nByte = 0;
                iBegin = 0;
                iEnd = 0;
                local_a4 = 0;
                uVar9 = (*psVar27->xNext)(pCursor_1,&zByte,&nByte,&iBegin,&iEnd,&local_a4);
                psVar4 = local_f0;
                if (uVar9 == 0) {
                  local_b8 = (byte *)((ulong)local_b8 & 0xffffffff00000000);
                  lVar29 = (long)local_f0 * 0x28;
                  local_120 = (Fts3Expr *)fts3ReallocOrFree(local_120,lVar29 + 0xc0);
                  if (local_120 == (Fts3Expr *)0x0) {
LAB_001a2610:
                    iVar8 = (int)local_108;
                    pbVar31 = local_110;
                    goto LAB_001a2624;
                  }
                  lVar26 = (long)(int)local_a0;
                  local_c8 = (Fts3Expr *)fts3ReallocOrFree(local_c8,nByte + lVar26);
                  if (local_c8 == (Fts3Expr *)0x0) {
                    local_c8 = (Fts3Expr *)0x0;
                    goto LAB_001a2610;
                  }
                  (&local_120[2].iDocid)[(long)psVar4 * 5] = 0;
                  (&local_120[2].iDocid + (long)psVar4 * 5)[1] = 0;
                  (&local_120[2].aMI)[(long)psVar4 * 5] = (u32 *)0x0;
                  (&local_120[2].pRight)[(long)psVar4 * 5] = (Fts3Expr *)0x0;
                  (&local_120[2].pRight + (long)psVar4 * 5)[1] = (Fts3Expr *)0x0;
                  memcpy((void *)((long)&local_c8->eType + lVar26),zByte,(long)nByte);
                  *(int *)(&local_120[2].pPhrase + (long)psVar4 * 5) = nByte;
                  uVar9 = 0;
                  uVar25 = 0;
                  if (iEnd < (int)local_48) {
                    uVar25 = (uint)(pbVar12[iEnd] == 0x2a);
                  }
                  *(uint *)((long)&local_120[2].pPhrase + lVar29 + 4) = uVar25;
                  if (0 < (long)iBegin) {
                    uVar9 = (uint)(zRight[iBegin] == 0x5e);
                  }
                  local_a0 = CONCAT44(local_a0._4_4_,(int)local_a0 + nByte);
                  *(uint *)(&local_120[2].iDocid + (long)psVar4 * 5) = uVar9;
                  local_f0 = (sqlite3_tokenizer_cursor *)((long)&local_f0->pTokenizer + 1);
                  iVar19 = (int)local_f0;
                  uVar13 = local_108;
                  psVar27 = local_58;
                  uVar9 = (uint)local_b8;
                }
                else {
                  local_f0 = (sqlite3_tokenizer_cursor *)((long)&local_f0->pTokenizer + 1);
                }
              }
              uVar13 = (ulong)(int)local_a0;
              (*psVar27->xClose)(pCursor_1);
              pCursor_1 = (sqlite3_tokenizer_cursor *)0x0;
              pFVar17 = local_c8;
              pFVar14 = local_120;
              pbVar31 = local_110;
            }
            else {
              uVar13 = 0;
              iVar19 = 0;
              pFVar17 = (Fts3Expr *)0x0;
              pFVar14 = (Fts3Expr *)0x0;
            }
            pbVar12 = local_e0;
            if (uVar9 == 0x65) {
              local_108 = uVar13;
              local_c8 = pFVar17;
              pFVar14 = (Fts3Expr *)fts3ReallocOrFree(pFVar14,uVar13 + (long)iVar19 * 0x28 + 0xc0);
              if (pFVar14 == (Fts3Expr *)0x0) {
                local_120 = (Fts3Expr *)0x0;
LAB_001a2624:
                pbVar12 = local_e0;
                if (pCursor_1 != (sqlite3_tokenizer_cursor *)0x0) {
                  (*local_58->xClose)(pCursor_1);
                }
                sqlite3_free(local_c8);
                sqlite3_free(local_120);
                pFVar14 = (Fts3Expr *)0x0;
                uVar9 = 7;
              }
              else {
                pFVar30 = (Fts3Phrase *)(pFVar14 + 1);
                memset(pFVar14,0,0x90);
                pFVar17 = local_c8;
                pFVar14->eType = 5;
                pFVar14->pPhrase = pFVar30;
                *(uint *)((long)&pFVar14[2].pLeft + 4) = local_bc;
                *(int *)&pFVar14[2].pLeft = iVar19;
                ppFVar28 = &pFVar14[2].pRight + (long)iVar19 * 5;
                if (local_c8 != (Fts3Expr *)0x0) {
                  memcpy(ppFVar28,local_c8,local_108);
                  sqlite3_free(pFVar17);
                  pFVar30 = pFVar14->pPhrase;
                }
                uVar13 = (ulong)(uint)pFVar30->nToken;
                if (pFVar30->nToken < 1) {
                  uVar13 = 0;
                }
                for (lVar29 = 0; uVar13 * 0x28 - lVar29 != 0; lVar29 = lVar29 + 0x28) {
                  *(Fts3Expr ***)((long)&pFVar30->aToken[0].z + lVar29) = ppFVar28;
                  ppFVar28 = (Fts3Expr **)
                             ((long)ppFVar28 + (long)*(int *)((long)&pFVar30->aToken[0].n + lVar29))
                  ;
                }
                uVar9 = 0;
                pbVar12 = local_e0;
                pbVar31 = local_110;
              }
            }
            bVar3 = true;
          }
          else {
            for (uVar13 = 0; local_38 != uVar13; uVar13 = uVar13 + 1) {
              pcVar21 = local_40[uVar13];
              sVar15 = strlen(pcVar21);
              iVar7 = (int)sVar15;
              if (((iVar7 < iVar19) && (zRight[iVar7] == 0x3a)) &&
                 (iVar8 = sqlite3_strnicmp(pcVar21,(char *)zRight,iVar7), iVar8 == 0)) {
                iVar19 = iVar7 + (int)local_120 + 1;
                goto LAB_001a2094;
              }
            }
            iVar19 = 0;
            uVar13 = (ulong)local_bc;
LAB_001a2094:
            pbVar12 = local_e0 + iVar19;
            uVar25 = (int)local_108 - iVar19;
            psVar27 = local_78->pModule;
            uVar23 = 0;
            if (0 < (int)uVar25) {
              uVar23 = (ulong)uVar25;
            }
            for (uVar16 = 0; uVar23 != uVar16; uVar16 = uVar16 + 1) {
              if (pbVar12[uVar16] == 0x22) {
                uVar23 = uVar16 & 0xffffffff;
                break;
              }
            }
            iVar7 = (int)uVar23;
            uVar9 = sqlite3Fts3OpenTokenizer
                              (local_78,(int)local_88,(char *)pbVar12,iVar7,&pCursor_1);
            if (uVar9 == 0) {
              nByte = 0;
              iBegin = 0;
              iEnd = 0;
              local_a4 = 0;
              local_f0 = pCursor_1;
              uVar10 = (*psVar27->xNext)(pCursor_1,&zByte,&nByte,&iBegin,&iEnd,&local_a4);
              if (uVar10 == 0) {
                pFVar14 = (Fts3Expr *)fts3MallocZero((long)nByte + 0xc0);
                if (pFVar14 == (Fts3Expr *)0x0) {
                  iVar7 = iEnd;
                  uVar9 = 7;
                  goto LAB_001a220b;
                }
                pFVar14->eType = 5;
                pFVar14->pPhrase = (Fts3Phrase *)(pFVar14 + 1);
                *(undefined4 *)&pFVar14[2].pLeft = 1;
                *(int *)((long)&pFVar14[2].pLeft + 4) = (int)uVar13;
                *(int *)&pFVar14[2].pPhrase = nByte;
                pFVar14[2].pRight = pFVar14 + 3;
                memcpy(pFVar14 + 3,zByte,(long)nByte);
                if ((iEnd < (int)uVar25) && (pbVar12[iEnd] == 0x2a)) {
                  *(undefined4 *)((long)&pFVar14[2].pPhrase + 4) = 1;
                  iEnd = iEnd + 1;
                }
                iVar8 = (int)local_108;
                uVar13 = (ulong)(uint)iBegin;
                bVar3 = false;
                while (0 < (int)uVar13) {
                  bVar33 = true;
                  if (pbVar12[uVar13 - 1] != 0x2d) {
                    if ((uVar32 == '\0') || (pbVar12[uVar13 - 1] != 0x5e)) break;
                    *(undefined4 *)&pFVar14[2].iDocid = 1;
                    bVar33 = bVar3;
                  }
                  bVar3 = bVar33;
                  uVar13 = uVar13 - 1;
                  iBegin = (int)uVar13;
                }
                bVar3 = !bVar3;
                uVar9 = 0;
                iVar7 = iEnd;
              }
              else {
                uVar9 = uVar10;
                if (uVar10 == 0x65) {
                  uVar9 = 0;
                }
                if (iVar7 == 0) {
                  uVar9 = uVar10;
                }
LAB_001a220b:
                pFVar14 = (Fts3Expr *)0x0;
                bVar3 = true;
                iVar8 = (int)local_108;
              }
              (*psVar27->xClose)(local_f0);
            }
            else {
              bVar3 = true;
              pFVar14 = (Fts3Expr *)0x0;
              iVar8 = (int)local_108;
            }
            iVar7 = iVar7 + iVar19;
            pbVar12 = local_e0;
            pbVar31 = local_110;
          }
LAB_001a2653:
          pFVar17 = local_d8;
          if ((uVar9 == 0) && (pFVar14 != (Fts3Expr *)0x0)) {
            iVar19 = pFVar14->eType;
            if (iVar19 != 5) {
              bVar33 = pFVar14->pLeft == (Fts3Expr *)0x0;
              bVar3 = !bVar33;
              if (!bVar33 || local_c0 == 0) goto LAB_001a26b5;
LAB_001a2b6f:
              pFVar17 = local_d8;
              pbVar31 = local_110;
              sqlite3Fts3ExprFree(pFVar14);
              uVar25 = local_f8;
              goto LAB_001a2b84;
            }
            if (!bVar3) {
              pFVar17 = (Fts3Expr *)fts3MallocZero(0x40);
              if (pFVar17 == (Fts3Expr *)0x0) {
                local_f8 = 7;
                goto LAB_001a2b6f;
              }
              pFVar17->eType = 2;
              pFVar17->pRight = pFVar14;
              pFVar14->pParent = pFVar17;
              uVar9 = 0;
              pbVar31 = local_110;
              if (local_d8 != (Fts3Expr *)0x0) {
                pFVar17->pLeft = local_d8;
                local_d8->pParent = pFVar17;
              }
              goto LAB_001a1e4c;
            }
            bVar3 = true;
            bVar33 = false;
LAB_001a26b5:
            if (local_c0 == 0 && bVar33 == false) {
              pFVar17 = (Fts3Expr *)fts3MallocZero(0x40);
              if (pFVar17 == (Fts3Expr *)0x0) {
                local_f8 = 7;
                goto LAB_001a2b6f;
              }
              pFVar17->eType = 3;
              insertBinaryOperator(&local_d0,local_100,pFVar17);
              local_100 = pFVar17;
LAB_001a270a:
              if (((!(bool)(iVar19 != 1 | bVar3)) && (local_100->eType != 5)) ||
                 ((!(bool)(bVar3 ^ 1U | iVar19 == 5) && (local_100->eType == 1))))
              goto LAB_001a2b6f;
            }
            else {
              if (local_100 != (Fts3Expr *)0x0) goto LAB_001a270a;
              local_100 = (Fts3Expr *)0x0;
            }
            pFVar17 = local_d8;
            pbVar31 = local_110;
            if (bVar3) {
              pFVar18 = pFVar14;
              if (local_d0 != (Fts3Expr *)0x0) {
                local_100->pRight = pFVar14;
                pFVar14->pParent = local_100;
                pFVar18 = local_d0;
              }
            }
            else {
              insertBinaryOperator(&local_d0,local_100,pFVar14);
              pFVar18 = local_d0;
            }
            local_d0 = pFVar18;
            local_c0 = (uint)bVar33;
            uVar9 = 0;
            pbVar12 = local_e0;
            local_100 = pFVar14;
          }
        }
        else {
          uVar9 = 0x65;
LAB_001a1e3c:
          iVar8 = (int)uVar13;
          pFVar17 = local_d8;
          pbVar12 = local_e0;
        }
LAB_001a1e4c:
        uVar13 = (ulong)(uint)(iVar8 - iVar7);
        pbVar12 = pbVar12 + iVar7;
      }
      local_f8 = 1;
      uVar25 = uVar9;
      if (local_c0 != 0) {
        uVar25 = local_f8;
      }
      if (local_d0 == (Fts3Expr *)0x0) {
        uVar25 = uVar9;
      }
      if (uVar9 != 0x65) {
        uVar25 = uVar9;
      }
      if (uVar25 != 0x65) {
LAB_001a2b84:
        local_f8 = uVar25;
        ppFVar28 = local_68;
        sqlite3Fts3ExprFree(local_d0);
        sqlite3Fts3ExprFree(pFVar17);
        *ppFVar28 = (Fts3Expr *)0x0;
        pFVar17 = (Fts3Expr *)0x0;
LAB_001a2b97:
        sqlite3Fts3ExprFree(pFVar17);
        *ppFVar28 = (Fts3Expr *)0x0;
        if (local_f8 == 1) {
          sqlite3Fts3ErrMsg(local_70,"malformed MATCH expression: [%s]",pbVar31);
        }
        else {
          if (local_f8 != 0x12) {
            return local_f8;
          }
          sqlite3Fts3ErrMsg(local_70,"FTS expression tree is too large (maximum depth %d)",0xc);
        }
        return 1;
      }
      pFVar14 = pFVar17;
      if (pFVar17 == (Fts3Expr *)0x0 || local_d0 == (Fts3Expr *)0x0) {
        pFVar14 = local_d0;
        uVar25 = local_f8;
        if (pFVar17 != (Fts3Expr *)0x0) goto LAB_001a2b84;
      }
      else {
        do {
          pFVar18 = pFVar14;
          pFVar14 = pFVar18->pLeft;
        } while (pFVar18->pLeft != (Fts3Expr *)0x0);
        pFVar18->pLeft = local_d0;
        local_d0->pParent = pFVar18;
        pFVar14 = pFVar17;
      }
      *local_68 = pFVar14;
      if (pFVar14 == (Fts3Expr *)0x0) goto LAB_001a2873;
      local_f8 = fts3ExprBalance(local_68,0xc);
      pFVar17 = *ppFVar28;
      if ((local_f8 != 0) || (local_f8 = fts3ExprCheckDepth(pFVar17,0xc), local_f8 != 0))
      goto LAB_001a2b97;
      local_f8 = 0;
    }
    psVar2 = (local_e8->base).pVtab;
    local_d0 = (Fts3Expr *)((ulong)local_d0 & 0xffffffff00000000);
    nByte = 0;
    iBegin = 0;
    fts3EvalAllocateReaders(local_e8,pFVar17,&nByte,&iBegin,(int *)&local_d0);
    if ((1 < nByte && (int)local_d0 == 0) && (*(char *)((long)&psVar2[0x12].zErrMsg + 4) != '\0')) {
      uVar13 = (ulong)(uint)nByte;
      aTC = (Fts3TokenAndCost *)sqlite3_malloc64((long)iBegin * 0x10 + uVar13 * 0x28);
      if (aTC == (Fts3TokenAndCost *)0x0) {
        local_d0 = (Fts3Expr *)CONCAT44(local_d0._4_4_,7);
      }
      else {
        pFVar24 = aTC + uVar13;
        pCursor_1 = (sqlite3_tokenizer_cursor *)aTC;
        zByte = (char *)pFVar24;
        fts3EvalTokenCosts(local_e8,(Fts3Expr *)0x0,local_e8->pExpr,(Fts3TokenAndCost **)&pCursor_1,
                           (Fts3Expr ***)&zByte,(int *)&local_d0);
        if ((int)local_d0 == 0) {
          uVar13 = (long)zByte - (long)pFVar24;
          iVar7 = (int)(((long)pCursor_1 - (long)aTC) / 0x28);
          iVar19 = fts3EvalSelectDeferred(local_e8,(Fts3Expr *)0x0,aTC,iVar7);
          for (lVar29 = 0; (iVar19 == 0 && (lVar29 < (int)(uVar13 >> 3))); lVar29 = lVar29 + 1) {
            iVar19 = fts3EvalSelectDeferred
                               (local_e8,(Fts3Expr *)(&pFVar24->pPhrase)[lVar29],aTC,iVar7);
          }
          local_d0 = (Fts3Expr *)CONCAT44(local_d0._4_4_,iVar19);
        }
        sqlite3_free(aTC);
      }
    }
    pCsr = local_e8;
    fts3EvalStartReaders(local_e8,local_e8->pExpr,(int *)&local_d0);
    iVar19 = (int)local_d0;
    sqlite3Fts3SegmentsClose(local_98);
    if (iVar19 != 0) {
      return iVar19;
    }
    pCsr->pNextId = pCsr->aDoclist;
    pCsr->iPrevId = 0;
  }
  if ((short)local_a8 == 1) {
    iVar19 = fts3CursorSeekStmt(pCsr);
    if (iVar19 != 0) {
      return iVar19;
    }
    iVar19 = sqlite3_bind_value(local_e8->pStmt,1,local_60);
  }
  else {
    if ((local_a8 & 0xffff) != 0) goto LAB_001a2b45;
    local_80 = (sqlite3_value *)((ulong)local_80 | (ulong)local_50);
    if (local_80 == (sqlite3_value *)0x0) {
      pcVar21 = "DESC";
      if (pCsr->bDesc == '\0') {
        pcVar21 = "ASC";
      }
      pcVar21 = sqlite3_mprintf("SELECT %s ORDER BY rowid %s",local_98->zReadExprlist,pcVar21);
    }
    else {
      pcVar21 = "DESC";
      if (pCsr->bDesc == '\0') {
        pcVar21 = "ASC";
      }
      pcVar21 = sqlite3_mprintf("SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
                                local_98->zReadExprlist,pCsr->iMinDocid,pCsr->iMaxDocid,pcVar21);
    }
    if (pcVar21 == (char *)0x0) {
      return 7;
    }
    iVar19 = sqlite3_prepare_v3(local_98->db,pcVar21,-1,1,&local_e8->pStmt,(char **)0x0);
    sqlite3_free(pcVar21);
  }
  pCsr = local_e8;
  if (iVar19 != 0) {
    return iVar19;
  }
LAB_001a2b45:
  iVar19 = fts3NextMethod(&pCsr->base);
  return iVar19;
}

Assistant:

static int fts3FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  int rc = SQLITE_OK;
  char *zSql;                     /* SQL statement used to access %_content */
  int eSearch;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;

  sqlite3_value *pCons = 0;       /* The MATCH or rowid constraint, if any */
  sqlite3_value *pLangid = 0;     /* The "langid = ?" constraint, if any */
  sqlite3_value *pDocidGe = 0;    /* The "docid >= ?" constraint, if any */
  sqlite3_value *pDocidLe = 0;    /* The "docid <= ?" constraint, if any */
  int iIdx;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(nVal);

  eSearch = (idxNum & 0x0000FFFF);
  assert( eSearch>=0 && eSearch<=(FTS3_FULLTEXT_SEARCH+p->nColumn) );
  assert( p->pSegments==0 );

  /* Collect arguments into local variables */
  iIdx = 0;
  if( eSearch!=FTS3_FULLSCAN_SEARCH ) pCons = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_LANGID ) pLangid = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_GE ) pDocidGe = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_LE ) pDocidLe = apVal[iIdx++];
  assert( iIdx==nVal );

  /* In case the cursor has been used before, clear it now. */
  fts3ClearCursor(pCsr);

  /* Set the lower and upper bounds on docids to return */
  pCsr->iMinDocid = fts3DocidRange(pDocidGe, SMALLEST_INT64);
  pCsr->iMaxDocid = fts3DocidRange(pDocidLe, LARGEST_INT64);

  if( idxStr ){
    pCsr->bDesc = (idxStr[0]=='D');
  }else{
    pCsr->bDesc = p->bDescIdx;
  }
  pCsr->eSearch = (i16)eSearch;

  if( eSearch!=FTS3_DOCID_SEARCH && eSearch!=FTS3_FULLSCAN_SEARCH ){
    int iCol = eSearch-FTS3_FULLTEXT_SEARCH;
    const char *zQuery = (const char *)sqlite3_value_text(pCons);

    if( zQuery==0 && sqlite3_value_type(pCons)!=SQLITE_NULL ){
      return SQLITE_NOMEM;
    }

    pCsr->iLangid = 0;
    if( pLangid ) pCsr->iLangid = sqlite3_value_int(pLangid);

    assert( p->base.zErrMsg==0 );
    rc = sqlite3Fts3ExprParse(p->pTokenizer, pCsr->iLangid,
        p->azColumn, p->bFts4, p->nColumn, iCol, zQuery, -1, &pCsr->pExpr, 
        &p->base.zErrMsg
    );
    if( rc!=SQLITE_OK ){
      return rc;
    }

    rc = fts3EvalStart(pCsr);
    sqlite3Fts3SegmentsClose(p);
    if( rc!=SQLITE_OK ) return rc;
    pCsr->pNextId = pCsr->aDoclist;
    pCsr->iPrevId = 0;
  }

  /* Compile a SELECT statement for this cursor. For a full-table-scan, the
  ** statement loops through all rows of the %_content table. For a
  ** full-text query or docid lookup, the statement retrieves a single
  ** row by docid.
  */
  if( eSearch==FTS3_FULLSCAN_SEARCH ){
    if( pDocidGe || pDocidLe ){
      zSql = sqlite3_mprintf(
          "SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
          p->zReadExprlist, pCsr->iMinDocid, pCsr->iMaxDocid,
          (pCsr->bDesc ? "DESC" : "ASC")
      );
    }else{
      zSql = sqlite3_mprintf("SELECT %s ORDER BY rowid %s", 
          p->zReadExprlist, (pCsr->bDesc ? "DESC" : "ASC")
      );
    }
    if( zSql ){
      rc = sqlite3_prepare_v3(p->db,zSql,-1,SQLITE_PREPARE_PERSISTENT,&pCsr->pStmt,0);
      sqlite3_free(zSql);
    }else{
      rc = SQLITE_NOMEM;
    }
  }else if( eSearch==FTS3_DOCID_SEARCH ){
    rc = fts3CursorSeekStmt(pCsr);
    if( rc==SQLITE_OK ){
      rc = sqlite3_bind_value(pCsr->pStmt, 1, pCons);
    }
  }
  if( rc!=SQLITE_OK ) return rc;

  return fts3NextMethod(pCursor);
}